

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_message.c
# Opt level: O3

int mpt_array_message(mpt_array *arr,mpt_message *ptr,int asep)

{
  size_t sVar1;
  void *pvVar2;
  mpt_type_traits *pmVar3;
  int iVar4;
  mpt_array a;
  mpt_message msg;
  mpt_array local_60;
  mpt_message local_58;
  
  local_60._buf = (mpt_buffer *)0x0;
  if ((ptr == (mpt_message *)0x0) || (sVar1 = mpt_message_length(ptr), sVar1 == 0)) {
    iVar4 = 0;
  }
  else {
    iVar4 = 0;
    pvVar2 = mpt_array_slice(&local_60,0,sVar1 + 1);
    if (pvVar2 == (void *)0x0) {
      return -4;
    }
    (local_60._buf)->_used = 0;
    local_58.used = ptr->used;
    local_58.base = ptr->base;
    local_58.cont = ptr->cont;
    local_58.clen = ptr->clen;
    sVar1 = mpt_message_argv(&local_58,asep);
    if (-1 < (long)sVar1) {
      iVar4 = 0;
      do {
        if (sVar1 == 0) {
          if (asep != 0) break;
        }
        else {
          pvVar2 = mpt_array_append(&local_60,sVar1,(void *)0x0);
          if (pvVar2 == (void *)0x0) goto LAB_0010947f;
          mpt_message_read(&local_58,sVar1,pvVar2);
        }
        pvVar2 = mpt_array_append(&local_60,1,(void *)0x0);
        if (pvVar2 == (void *)0x0) {
LAB_0010947f:
          mpt_array_clone(&local_60,(mpt_array *)0x0);
          return -0x11;
        }
        iVar4 = iVar4 + 1;
        mpt_message_read(&local_58,1,(void *)0x0);
        sVar1 = mpt_message_argv(&local_58,asep);
      } while (-1 < (long)sVar1);
    }
    pmVar3 = mpt_type_traits(99);
    (local_60._buf)->_content_traits = pmVar3;
    mpt_array_clone(arr,&local_60);
    arr = &local_60;
  }
  mpt_array_clone(arr,(mpt_array *)0x0);
  return iVar4;
}

Assistant:

extern int mpt_array_message(MPT_STRUCT(array) *arr, const MPT_STRUCT(message) *ptr, int asep)
{
	MPT_STRUCT(message) msg;
	MPT_STRUCT(array) a = MPT_ARRAY_INIT;
	char *base;
	ssize_t len;
	int narg = 0;
	
	if (!ptr || !(len = mpt_message_length(ptr))) {
		mpt_array_clone(arr, 0);
		return narg;
	}
	/* prepare for maximum size */
	if (!(base = mpt_array_slice(&a, 0, len+1))) {
		return MPT_ERROR(BadOperation);
	}
	a._buf->_used = 0;
	
	msg = *ptr;
	while ((len = mpt_message_argv(&msg, asep)) >= 0) {
		if (!len) {
			if (asep) {
				break;
			}
		}
		else if (!(base = mpt_array_append(&a, len, 0))) {
			mpt_array_clone(&a, 0);
			return MPT_ERROR(MissingBuffer);
		}
		/* save next argument to array */
		else {
			mpt_message_read(&msg, len, base);
		}
		++narg;
		/* save argument separation */
		if (!(base = mpt_array_append(&a, 1, 0))) {
			mpt_array_clone(&a, 0);
			return MPT_ERROR(MissingBuffer);
		}
		/* skip argument separation */
		mpt_message_read(&msg, 1, 0);
	}
	a._buf->_content_traits = mpt_type_traits('c');
	mpt_array_clone(arr, &a);
	mpt_array_clone(&a, 0);
	return narg;
}